

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,std::less<void>>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>_>
          *lhs,char *op,initializer_list<int> *rhs)

{
  ostream *poVar1;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<boost::iterator_range<burst::symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,std::less<void>>>>
            (&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  poVar1 = tlssPush();
  test_detail::print_range<std::initializer_list<int>,burst::identity_fn>(poVar1,op);
  tlssPop();
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }